

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O2

char * __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::GetInterpolationQualifier
          (ConversionStream *this,ShaderParameterInfo *ParamInfo)

{
  byte bVar1;
  __type _Var2;
  char *pcVar3;
  HLSLTokenInfo *pHVar4;
  char (*in_RCX) [35];
  string msg;
  string local_30;
  
  bVar1 = ParamInfo->interpolationQualifier - Linear;
  if (bVar1 < 5) {
    pcVar3 = &DAT_005de7e0 + *(int *)(&DAT_005de7e0 + (ulong)bVar1 * 4);
  }
  else {
    pHVar4 = Parsing::HLSLTokenizer::FindKeyword
                       (&this->m_Converter->m_HLSLTokenizer,&ParamInfo->Type);
    if (pHVar4 != (HLSLTokenInfo *)0x0) {
      _Var2 = std::operator==(&pHVar4->Literal,&ParamInfo->Type);
      if (!_Var2) {
        FormatString<char[26],char[35]>
                  (&local_30,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"Keyword->Literal == ParamInfo.Type",in_RCX);
        DebugAssertionFailed
                  (local_30._M_dataplus._M_p,"GetInterpolationQualifier",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
                   ,0xb51);
        std::__cxx11::string::~string((string *)&local_30);
      }
      if (0xffffffc0 < pHVar4->Type - kw_matrix || 0xffffffd5 < pHVar4->Type - kw_min16float) {
        return "flat";
      }
    }
    pcVar3 = "";
  }
  return pcVar3;
}

Assistant:

const char* HLSL2GLSLConverterImpl::ConversionStream::GetInterpolationQualifier(const ShaderParameterInfo& ParamInfo) const
{
    switch (ParamInfo.interpolationQualifier)
    {
        // clang-format off
        case ShaderParameterInfo::InterpolationQualifier::Linear:          return "smooth";
        case ShaderParameterInfo::InterpolationQualifier::Nointerpolation: return "flat";
        case ShaderParameterInfo::InterpolationQualifier::Noperspective:   return "noperspective";
        case ShaderParameterInfo::InterpolationQualifier::Centroid:        return "centroid";
        case ShaderParameterInfo::InterpolationQualifier::Sample:          return "sample";
        // clang-format on
        default:
            break; // To avoid clang/gcc error
    }

    if (const HLSLTokenInfo* Keyword = m_Converter.m_HLSLTokenizer.FindKeyword(ParamInfo.Type))
    {
        VERIFY_EXPR(Keyword->Literal == ParamInfo.Type);
        auto kw = Keyword->Type;
        if ((kw >= TokenType::kw_int && kw <= TokenType::kw_int4x4) ||
            (kw >= TokenType::kw_uint && kw <= TokenType::kw_uint4x4) ||
            (kw >= TokenType::kw_min16int && kw <= TokenType::kw_min16int4x4) ||
            (kw >= TokenType::kw_min12int && kw <= TokenType::kw_min12int4x4) ||
            (kw >= TokenType::kw_min16uint && kw <= TokenType::kw_min16uint4x4))
            return "flat";
    }

    return "";
}